

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  ImGuiStoragePair *pIVar1;
  long lVar2;
  undefined8 *in_RDX;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RSI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ptrdiff_t off;
  
  if ((in_RSI < (ImVector<ImGuiStorage::ImGuiStoragePair> *)in_RDI->Data) ||
     ((ImVector<ImGuiStorage::ImGuiStoragePair> *)(in_RDI->Data + in_RDI->Size) < in_RSI)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x61f,"insert","ImGui ASSERT FAILED: %s","it >= Data && it <= Data + Size");
  }
  lVar2 = (long)in_RSI - (long)in_RDI->Data >> 4;
  if (in_RDI->Size == in_RDI->Capacity) {
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(in_RSI,(int)((ulong)in_RDX >> 0x20));
  }
  if (lVar2 < in_RDI->Size) {
    memmove(in_RDI->Data + lVar2 + 1,in_RDI->Data + lVar2,(in_RDI->Size - lVar2) * 0x10);
  }
  pIVar1 = in_RDI->Data;
  *(undefined8 *)(pIVar1 + lVar2) = *in_RDX;
  pIVar1[lVar2].field_1 = *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)(in_RDX + 1);
  in_RDI->Size = in_RDI->Size + 1;
  return in_RDI->Data + lVar2;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }